

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O3

void __thiscall
TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>::FinishWriting
          (TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *this)

{
  ostream *poVar1;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FinishWriting",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ostream::flush();
  this->fFinish = 1;
  std::condition_variable::notify_all();
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::FinishWriting(){
	// FinishWriting already has a lock
	cout << endl << "FinishWriting" << endl;
	cout.flush();     
	fFinish = 1;
	// FinishWriting already has a lock
    fwritecond.notify_all();
}